

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectcleanuphandler.cpp
# Opt level: O3

void __thiscall QObjectCleanupHandler::~QObjectCleanupHandler(QObjectCleanupHandler *this)

{
  int *piVar1;
  
  *(undefined ***)this = &PTR_metaObject_0069b460;
  clear(this);
  piVar1 = *(int **)(this + 0x10);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x10),8,0x10);
    }
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QObjectCleanupHandler::~QObjectCleanupHandler()
{
    clear();
}